

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramClear(VP8LHistogram *h)

{
  undefined4 uVar1;
  int iVar2;
  undefined8 *in_RDI;
  int histo_size;
  int cache_bits;
  uint32_t *literal;
  VP8LHistogram *h_00;
  
  h_00 = (VP8LHistogram *)*in_RDI;
  uVar1 = *(undefined4 *)(in_RDI + 0x195);
  iVar2 = GetHistogramSize((int)((ulong)h_00 >> 0x20));
  memset(in_RDI,0,(long)iVar2);
  *(undefined4 *)(in_RDI + 0x195) = uVar1;
  *in_RDI = h_00;
  HistogramStatsClear(h_00);
  return;
}

Assistant:

static void HistogramClear(VP8LHistogram* const h) {
  uint32_t* const literal = h->literal;
  const int cache_bits = h->palette_code_bits;
  const int histo_size = GetHistogramSize(cache_bits);
  memset(h, 0, histo_size);
  h->palette_code_bits = cache_bits;
  h->literal = literal;
  HistogramStatsClear(h);
}